

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
libcellml::Generator::GeneratorImpl::addImplementationVoiInfoCode(GeneratorImpl *this)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Type TVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  VariablePtr voiVariable;
  string name;
  string component;
  string units;
  string type;
  long *local_178;
  long local_168;
  undefined8 uStack_160;
  Variable *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  TVar2 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  if ((TVar2 != ODE) && (TVar2 != DAE)) {
    return;
  }
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_
            (&local_148,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = false;
  }
  else {
    GeneratorProfile::variableInfoEntryString_abi_cxx11_
              (&local_108,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_108._M_string_length == 0) {
      bVar7 = false;
    }
    else {
      GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
                (&local_128,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      bVar7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return;
  }
  AnalyserModel::voi((AnalyserModel *)&local_148);
  AnalyserVariable::variable((AnalyserVariable *)local_148._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length);
  }
  NamedEntity::name_abi_cxx11_(&local_148,&local_158->super_NamedEntity);
  Variable::units(local_158);
  NamedEntity::name_abi_cxx11_(&local_108,(NamedEntity *)local_128._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
  }
  this_00 = local_150;
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_150->_M_use_count = local_150->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_150->_M_use_count = local_150->_M_use_count + 1;
    }
  }
  owningComponent((ParentedEntityConstPtr *)&local_a8);
  NamedEntity::name_abi_cxx11_(&local_128,(NamedEntity *)local_a8._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
            (&local_a8,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar7 = (this->mCode)._M_string_length != 0;
  pcVar4 = "";
  if (bVar7) {
    pcVar4 = "\n";
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar4,pcVar4 + bVar7);
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_
            (&local_48,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"[CODE]","");
  generateVariableInfoEntryCode(&local_68,this,&local_148,&local_108,&local_128,&local_a8);
  replace(&local_e8,&local_48,&local_88,&local_68);
  uVar5 = 0xf;
  if (local_c8 != local_b8) {
    uVar5 = local_b8[0];
  }
  if (uVar5 < local_e8._M_string_length + local_c0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      uVar6 = local_e8.field_2._M_allocated_capacity;
    }
    if (local_e8._M_string_length + local_c0 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_001e2d45;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8._M_dataplus._M_p);
LAB_001e2d45:
  local_178 = &local_168;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_168 = *plVar1;
    uStack_160 = puVar3[3];
  }
  else {
    local_168 = *plVar1;
    local_178 = (long *)*puVar3;
  }
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::_M_append((char *)&this->mCode,(ulong)local_178);
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addImplementationVoiInfoCode()
{
    if (modelHasOdes()
        && !mProfile->implementationVoiInfoString().empty()
        && !mProfile->variableInfoEntryString().empty()
        && !mProfile->variableOfIntegrationVariableTypeString().empty()) {
        auto voiVariable = mModel->voi()->variable();
        auto name = voiVariable->name();
        auto units = voiVariable->units()->name();
        auto component = owningComponent(voiVariable)->name();
        auto type = mProfile->variableOfIntegrationVariableTypeString();

        mCode += newLineIfNeeded()
                 + replace(mProfile->implementationVoiInfoString(),
                           "[CODE]", generateVariableInfoEntryCode(name, units, component, type));
    }
}